

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen1_2x3.cpp
# Opt level: O0

size_t Assimp::STEP::GenericFill<Assimp::IFC::Schema_2x3::IfcIShapeProfileDef>
                 (DB *db,LIST *params,IfcIShapeProfileDef *in)

{
  size_t sVar1;
  TypeError *this;
  element_type *peVar2;
  long local_368;
  long local_358;
  long local_330;
  long local_308;
  long local_2e0;
  long local_2b8;
  TypeError *t_4;
  undefined1 local_238 [8];
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg_4;
  TypeError *t_3;
  undefined1 local_1c8 [8];
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg_3;
  TypeError *t_2;
  undefined1 local_158 [8];
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg_2;
  TypeError *t_1;
  undefined1 local_e8 [8];
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg_1;
  TypeError *t;
  reference local_80;
  undefined1 local_70 [8];
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg;
  allocator<char> local_49;
  string local_48;
  size_t local_28;
  size_t base;
  IfcIShapeProfileDef *in_local;
  LIST *params_local;
  DB *db_local;
  
  base = (size_t)in;
  in_local = (IfcIShapeProfileDef *)params;
  params_local = (LIST *)db;
  local_28 = GenericFill<Assimp::IFC::Schema_2x3::IfcParameterizedProfileDef>
                       (db,params,&in->super_IfcParameterizedProfileDef);
  sVar1 = EXPRESS::LIST::GetSize((LIST *)in_local);
  if (sVar1 < 8) {
    arg.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._3_1_ = 1;
    this = (TypeError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"expected 8 arguments to IfcIShapeProfileDef",&local_49);
    TypeError::TypeError(this,&local_48,0xffffffffffffffff,0xffffffffffffffff);
    arg.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._3_1_ = 0;
    __cxa_throw(this,&TypeError::typeinfo,TypeError::~TypeError);
  }
  local_28 = local_28 + 1;
  EXPRESS::LIST::operator[]((LIST *)local_70,(size_t)in_local);
  peVar2 = std::
           __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_70);
  if (peVar2 == (element_type *)0x0) {
    local_2b8 = 0;
  }
  else {
    local_2b8 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::ISDERIVED::typeinfo,0);
  }
  if (local_2b8 == 0) {
    GenericConvert<double>
              ((double *)(base + 0x80),(shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70
               ,(DB *)params_local);
  }
  else {
    std::bitset<5UL>::operator[]((bitset<5UL> *)&local_80,base + 0x78);
    std::bitset<5UL>::reference::operator=(&local_80,true);
    std::bitset<5UL>::reference::~reference(&local_80);
  }
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
            ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70);
  local_28 = local_28 + 1;
  EXPRESS::LIST::operator[]((LIST *)local_e8,(size_t)in_local);
  peVar2 = std::
           __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_e8);
  if (peVar2 == (element_type *)0x0) {
    local_2e0 = 0;
  }
  else {
    local_2e0 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::ISDERIVED::typeinfo,0);
  }
  if (local_2e0 == 0) {
    GenericConvert<double>
              ((double *)(base + 0x88),(shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_e8
               ,(DB *)params_local);
  }
  else {
    std::bitset<5UL>::operator[]((bitset<5UL> *)&t_1,base + 0x78);
    std::bitset<5UL>::reference::operator=((reference *)&t_1,true);
    std::bitset<5UL>::reference::~reference((reference *)&t_1);
  }
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
            ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_e8);
  local_28 = local_28 + 1;
  EXPRESS::LIST::operator[]((LIST *)local_158,(size_t)in_local);
  peVar2 = std::
           __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_158);
  if (peVar2 == (element_type *)0x0) {
    local_308 = 0;
  }
  else {
    local_308 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::ISDERIVED::typeinfo,0);
  }
  if (local_308 == 0) {
    GenericConvert<double>
              ((double *)(base + 0x90),
               (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_158,(DB *)params_local);
  }
  else {
    std::bitset<5UL>::operator[]((bitset<5UL> *)&t_2,base + 0x78);
    std::bitset<5UL>::reference::operator=((reference *)&t_2,true);
    std::bitset<5UL>::reference::~reference((reference *)&t_2);
  }
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
            ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_158);
  local_28 = local_28 + 1;
  EXPRESS::LIST::operator[]((LIST *)local_1c8,(size_t)in_local);
  peVar2 = std::
           __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_1c8);
  if (peVar2 == (element_type *)0x0) {
    local_330 = 0;
  }
  else {
    local_330 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::ISDERIVED::typeinfo,0);
  }
  if (local_330 == 0) {
    GenericConvert<double>
              ((double *)(base + 0x98),
               (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_1c8,(DB *)params_local);
  }
  else {
    std::bitset<5UL>::operator[]((bitset<5UL> *)&t_3,base + 0x78);
    std::bitset<5UL>::reference::operator=((reference *)&t_3,true);
    std::bitset<5UL>::reference::~reference((reference *)&t_3);
  }
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
            ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_1c8);
  local_28 = local_28 + 1;
  EXPRESS::LIST::operator[]((LIST *)local_238,(size_t)in_local);
  peVar2 = std::
           __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_238);
  if (peVar2 == (element_type *)0x0) {
    local_358 = 0;
  }
  else {
    local_358 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::ISDERIVED::typeinfo,0);
  }
  if (local_358 == 0) {
    peVar2 = std::
             __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_238);
    if (peVar2 == (element_type *)0x0) {
      local_368 = 0;
    }
    else {
      local_368 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::UNSET::typeinfo,0);
    }
    if (local_368 == 0) {
      GenericConvert<Assimp::STEP::Maybe<double>>
                ((Maybe<double> *)(base + 0xa0),
                 (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_238,(DB *)params_local);
    }
  }
  else {
    std::bitset<5UL>::operator[]((bitset<5UL> *)&t_4,base + 0x78);
    std::bitset<5UL>::reference::operator=((reference *)&t_4,true);
    std::bitset<5UL>::reference::~reference((reference *)&t_4);
  }
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
            ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_238);
  return local_28;
}

Assistant:

size_t GenericFill<IfcIShapeProfileDef>(const DB& db, const LIST& params, IfcIShapeProfileDef* in)
{
	size_t base = GenericFill(db,params,static_cast<IfcParameterizedProfileDef*>(in));
	if (params.GetSize() < 8) { throw STEP::TypeError("expected 8 arguments to IfcIShapeProfileDef"); }    do { // convert the 'OverallWidth' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const ISDERIVED*>(&*arg)) { in->ObjectHelper<Assimp::IFC::Schema_2x3::IfcIShapeProfileDef,5>::aux_is_derived[0]=true; break; }
        try { GenericConvert( in->OverallWidth, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 3 to IfcIShapeProfileDef to be a `IfcPositiveLengthMeasure`")); }
    } while(0);
    do { // convert the 'OverallDepth' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const ISDERIVED*>(&*arg)) { in->ObjectHelper<Assimp::IFC::Schema_2x3::IfcIShapeProfileDef,5>::aux_is_derived[1]=true; break; }
        try { GenericConvert( in->OverallDepth, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 4 to IfcIShapeProfileDef to be a `IfcPositiveLengthMeasure`")); }
    } while(0);
    do { // convert the 'WebThickness' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const ISDERIVED*>(&*arg)) { in->ObjectHelper<Assimp::IFC::Schema_2x3::IfcIShapeProfileDef,5>::aux_is_derived[2]=true; break; }
        try { GenericConvert( in->WebThickness, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 5 to IfcIShapeProfileDef to be a `IfcPositiveLengthMeasure`")); }
    } while(0);
    do { // convert the 'FlangeThickness' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const ISDERIVED*>(&*arg)) { in->ObjectHelper<Assimp::IFC::Schema_2x3::IfcIShapeProfileDef,5>::aux_is_derived[3]=true; break; }
        try { GenericConvert( in->FlangeThickness, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 6 to IfcIShapeProfileDef to be a `IfcPositiveLengthMeasure`")); }
    } while(0);
    do { // convert the 'FilletRadius' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const ISDERIVED*>(&*arg)) { in->ObjectHelper<Assimp::IFC::Schema_2x3::IfcIShapeProfileDef,5>::aux_is_derived[4]=true; break; }
        if (dynamic_cast<const UNSET*>(&*arg)) break;
        try { GenericConvert( in->FilletRadius, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 7 to IfcIShapeProfileDef to be a `IfcPositiveLengthMeasure`")); }
    } while(0);
	return base;
}